

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiobj_ary.c
# Opt level: O0

int fiobj_ary_remove2(FIOBJ ary,FIOBJ data)

{
  int iVar1;
  size_t sVar2;
  FIOBJ local_20;
  FIOBJ data_local;
  FIOBJ ary_local;
  
  local_20 = data;
  data_local = ary;
  if (ary != 0) {
    sVar2 = fiobj_type_is(ary,FIOBJ_T_ARRAY);
    if (sVar2 != 0) {
      iVar1 = fio_ary___remove2((fio_ary___s *)(data_local + 8),local_20,&local_20);
      if (iVar1 == -1) {
        ary_local._4_4_ = -1;
      }
      else {
        fiobj_free(local_20);
        ary_local._4_4_ = 0;
      }
      return ary_local._4_4_;
    }
  }
  __assert_fail("ary && FIOBJ_TYPE_IS(ary, FIOBJ_T_ARRAY)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/1byte2bytes[P]LotteHTTP/facil.io-0.7.3/lib/facil/fiobj/fiobj_ary.c"
                ,0xe6,"int fiobj_ary_remove2(FIOBJ, FIOBJ)");
}

Assistant:

int fiobj_ary_remove2(FIOBJ ary, FIOBJ data) {
  assert(ary && FIOBJ_TYPE_IS(ary, FIOBJ_T_ARRAY));
  if (-1 == fio_ary___remove2(&obj2ary(ary)->ary, data, &data)) {
    return -1;
  }
  fiobj_free(data);
  return 0;
}